

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_command * nk_draw_list_push_command(nk_draw_list *list,nk_rect clip,nk_handle texture)

{
  nk_buffer *pnVar1;
  nk_draw_command *pnVar2;
  void *pvVar3;
  nk_size nVar4;
  float local_28;
  float fStack_24;
  
  pnVar2 = (nk_draw_command *)nk_buffer_alloc(list->buffer,NK_BUFFER_BACK,0x20,8);
  if (pnVar2 != (nk_draw_command *)0x0) {
    if (list->cmd_count == 0) {
      pnVar1 = list->buffer;
      if (pnVar1 == (nk_buffer *)0x0) {
        pvVar3 = (void *)0x0;
        nVar4 = 0;
      }
      else {
        pvVar3 = (pnVar1->memory).ptr;
        nVar4 = (pnVar1->memory).size;
      }
      list->cmd_offset = (long)pvVar3 + (nVar4 - (long)pnVar2);
    }
    pnVar2->elem_count = 0;
    local_28 = clip.x;
    fStack_24 = clip.y;
    (pnVar2->clip_rect).x = local_28;
    (pnVar2->clip_rect).y = fStack_24;
    (pnVar2->clip_rect).w = clip.w;
    (pnVar2->clip_rect).h = clip.h;
    pnVar2->texture = texture;
    list->cmd_count = list->cmd_count + 1;
    (list->clip_rect).x = local_28;
    (list->clip_rect).y = fStack_24;
    (list->clip_rect).w = clip.w;
    (list->clip_rect).h = clip.h;
  }
  return pnVar2;
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_push_command(struct nk_draw_list *list, struct nk_rect clip,
nk_handle texture)
{
NK_STORAGE const nk_size cmd_align = NK_ALIGNOF(struct nk_draw_command);
NK_STORAGE const nk_size cmd_size = sizeof(struct nk_draw_command);
struct nk_draw_command *cmd;

NK_ASSERT(list);
cmd = (struct nk_draw_command*)
nk_buffer_alloc(list->buffer, NK_BUFFER_BACK, cmd_size, cmd_align);

if (!cmd) return 0;
if (!list->cmd_count) {
nk_byte *memory = (nk_byte*)nk_buffer_memory(list->buffer);
nk_size total = nk_buffer_total(list->buffer);
memory = nk_ptr_add(nk_byte, memory, total);
list->cmd_offset = (nk_size)(memory - (nk_byte*)cmd);
}

cmd->elem_count = 0;
cmd->clip_rect = clip;
cmd->texture = texture;
#ifdef NK_INCLUDE_COMMAND_USERDATA
cmd->userdata = list->userdata;
#endif

list->cmd_count++;
list->clip_rect = clip;
return cmd;
}